

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Poly.cpp
# Opt level: O2

void __thiscall chrono::ChFunction_Poly::ArchiveOUT(ChFunction_Poly *this,ChArchiveOut *marchive)

{
  ChNameValue<int> local_48;
  ChNameValue<double[6]> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Poly>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_30._value = &this->coeff;
  local_30._name = "coeff";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->order;
  local_48._name = "order";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChFunction_Poly::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Poly>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(coeff);
    marchive << CHNVP(order);
}